

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADAFWArrayPrimitiveType.h
# Opt level: O2

void __thiscall
COLLADAFW::ArrayPrimitiveType<float>::reallocMemory
          (ArrayPrimitiveType<float> *this,size_t minCapacity)

{
  float *pfVar1;
  ulong capacity;
  
  if (this->mCapacity < minCapacity) {
    capacity = (this->mCapacity * 3 >> 1) + 1;
    if (capacity <= minCapacity) {
      capacity = minCapacity;
    }
    this->mCapacity = capacity;
    if (this->mData == (float *)0x0) {
      allocMemory(this,capacity,this->mFlags);
      return;
    }
    pfVar1 = (float *)realloc(this->mData,capacity << 2);
    this->mData = pfVar1;
    if (this->mCapacity < this->mCount) {
      this->mCount = this->mCapacity;
    }
  }
  return;
}

Assistant:

void reallocMemory ( size_t minCapacity )
		{
			if ( minCapacity <= mCapacity)
				return;
			size_t newCapacity = ( mCapacity * 3 ) / 2 + 1;
			if (newCapacity < minCapacity)
				newCapacity = minCapacity;
			mCapacity = newCapacity;

			if ( mData )
			{
				mData = ( Type* ) realloc ( mData, mCapacity * sizeof ( Type ) );
				if ( mCount > mCapacity )
					mCount = mCapacity;
			}
			else
			{
				allocMemory(newCapacity, mFlags);
			}
		}